

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gepard-engine.cpp
# Opt level: O2

void __thiscall gepard::GepardEngine::rect(GepardEngine *this,Float x,Float y,Float w,Float h)

{
  moveTo(this,x,y);
  lineTo(this,w + x,y);
  lineTo(this,w + x,h + y);
  lineTo(this,x,h + y);
  closePath(this);
  return;
}

Assistant:

void GepardEngine::rect(Float x, Float y, Float w, Float h)
{
    moveTo(x, y);
    lineTo(x + w, y);
    lineTo(x + w, y + h);
    lineTo(x, y + h);
    closePath();
}